

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrCMP0xcd(CPU *this)

{
  uint8_t reg;
  uint8_t argument;
  
  reg = this->A;
  argument = absolute_addr(this);
  CMP(this,reg,argument);
  return 4;
}

Assistant:

int CPU::instrCMP0xcd() {
	CMP(A, absolute_addr());
	return 4;
}